

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

Vec_Int_t * Lpk_ComputeBoundSets(Kit_DsdNtk_t *p,int nSizeMax)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Kit_DsdObj_t *pKVar4;
  int local_38;
  int i;
  int Number;
  uint Entry;
  uint uSupport;
  Vec_Int_t *vSets;
  int nSizeMax_local;
  Kit_DsdNtk_t *p_local;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                  ,0xa7,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
  }
  p_00 = Vec_IntAlloc(100);
  Vec_IntPush(p_00,0);
  pKVar4 = Kit_DsdNtkRoot(p);
  if (((uint)*pKVar4 >> 6 & 7) != 1) {
    pKVar4 = Kit_DsdNtkRoot(p);
    if (((uint)*pKVar4 >> 6 & 7) == 2) {
      pKVar4 = Kit_DsdNtkRoot(p);
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar4 + 1));
      uVar2 = 1 << ((byte)iVar1 & 0x1f);
      iVar1 = Kit_WordCountOnes(uVar2);
      if (iVar1 <= nSizeMax) {
        Vec_IntPush(p_00,uVar2);
      }
    }
    else {
      uVar2 = Lpk_ComputeBoundSets_rec(p,(uint)p->Root,p_00,nSizeMax);
      if ((uVar2 & 0xffff0000) != 0) {
        __assert_fail("(uSupport & 0xFFFF0000) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                      ,0xb4,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
      }
      iVar1 = Kit_WordCountOnes(uVar2);
      if (iVar1 <= nSizeMax) {
        Vec_IntPush(p_00,uVar2);
      }
      for (local_38 = 0; iVar1 = Vec_IntSize(p_00), local_38 < iVar1; local_38 = local_38 + 1) {
        uVar3 = Vec_IntEntry(p_00,local_38);
        Vec_IntWriteEntry(p_00,local_38,uVar3 | (uVar2 & (uVar3 ^ 0xffffffff)) << 0x10);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Lpk_ComputeBoundSets( Kit_DsdNtk_t * p, int nSizeMax )
{
    Vec_Int_t * vSets;
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    vSets = Vec_IntAlloc( 100 );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return vSets;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
            Vec_IntPush( vSets, uSupport );
        return vSets;
    }
    uSupport = Lpk_ComputeBoundSets_rec( p, p->Root, vSets, nSizeMax );
    assert( (uSupport & 0xFFFF0000) == 0 );
    // add the total support of the network
    if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
        Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return vSets;
}